

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LAJIVM.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  istream *piVar4;
  reference pcVar5;
  string local_128 [32];
  string local_108 [32];
  long local_e8;
  size_type temp_1;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [8];
  string temp;
  string local_90 [36];
  undefined4 local_6c;
  int e;
  string local_58 [8];
  string r_str;
  string local_38 [8];
  string str;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  init_all();
  if (argc == 2) {
    std::__cxx11::string::operator=(local_58,argv[1]);
    std::__cxx11::string::string(local_90,local_58);
    argv_local._4_4_ = doit((string *)local_90);
    std::__cxx11::string::~string(local_90);
    local_6c = 1;
  }
  else if (argc == 3) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"d");
    if (bVar2) {
      is_debug = true;
      std::__cxx11::string::operator=(local_58,argv[2]);
      std::__cxx11::string::string(local_d8,local_58);
      argv_local._4_4_ = doit((string *)local_d8);
      std::__cxx11::string::~string(local_d8);
    }
    else {
      printf(anon_var_dwarf_53cb);
      argv_local._4_4_ = 1;
    }
    local_6c = 1;
    std::__cxx11::string::~string(local_b0);
  }
  else {
    printf(anon_var_dwarf_53e1);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,local_38);
    bVar3 = std::ios::operator!(piVar4 + *(long *)(*(long *)piVar4 + -0x18));
    if ((bVar3 & 1) != 0) {
      exit(0);
    }
    temp_1 = std::__cxx11::string::begin();
    pcVar5 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&temp_1);
    if (*pcVar5 == 'd') {
      local_e8 = std::__cxx11::string::find((char)local_38,0x20);
      if (local_e8 == -1) {
        std::__cxx11::string::operator=(local_58,local_38);
      }
      else {
        std::__cxx11::string::substr((ulong)local_108,(ulong)local_38);
        std::__cxx11::string::operator=(local_58,local_108);
        std::__cxx11::string::~string(local_108);
        is_debug = true;
      }
    }
    else {
      std::__cxx11::string::operator=(local_58,local_38);
    }
    std::__cxx11::string::string(local_128,local_58);
    argv_local._4_4_ = doit((string *)local_128);
    std::__cxx11::string::~string(local_128);
    local_6c = 1;
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	std::string str;
	std::string r_str;
	try { init_all(); }
	catch (int e) {
		printf("初始化失败 %08X\n",e);
		return -1;
	}
	if (argc == 2) {
		r_str = argv[1];
        return  doit(r_str);
	}else if(argc == 3)
	{
		std::string temp = argv[1];
		if (temp == "d") {
			is_debug = true;
			r_str = argv[2];
            return doit(r_str);
		}else{
			printf("命令行参数错误\n");
            return 1;
		}
	}

	printf("虚拟机初始化完成请输入二进制文件路径,输入ctrl+z退出：\n");
	if (!std::getline(std::cin,str)) exit(0);
	if (*str.begin() == 'd') {
		auto temp = str.find(' ', 1);
		if (temp != std::string::npos) {
			r_str = str.substr(temp + 1);
			is_debug = true;
		}
		else r_str = str;
	}
	else r_str = str;
    return doit(r_str);
}